

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::OP_NewScObjectSimple(InterpreterStackFrame *this)

{
  bool bVar1;
  JavascriptLibrary *this_00;
  DynamicObject *local_18;
  Var object;
  InterpreterStackFrame *this_local;
  
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  local_18 = JavascriptLibrary::CreateObject(this_00,true,0);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    local_18 = (DynamicObject *)Js::JavascriptProxy::AutoProxyWrapper(local_18);
  }
  return local_18;
}

Assistant:

Var InterpreterStackFrame::OP_NewScObjectSimple()
    {
        Var object = scriptContext->GetLibrary()->CreateObject(true);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = JavascriptProxy::AutoProxyWrapper(object);
        }
#endif
        return object;
    }